

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sipc.c
# Opt level: O0

int nn_sipc_recv(nn_pipebase *self,nn_msg *msg)

{
  nn_msg *dst;
  size_t in_RSI;
  void *in_RDI;
  nn_usock *unaff_retaddr;
  nn_sipc *sipc;
  nn_msg *in_stack_ffffffffffffffd8;
  nn_msg *fd;
  
  if (in_RDI == (void *)0x0) {
    dst = (nn_msg *)0x0;
  }
  else {
    dst = (nn_msg *)((long)in_RDI + -0x210);
  }
  if (*(int *)((long)&(dst->body).u + 0x18) != 4) {
    nn_backtrace_print();
    fprintf(_stderr,"Assertion failed: %d == %s (%s:%d)\n",
            (ulong)*(uint *)((long)&(dst->body).u + 0x18),"NN_SIPC_STATE_ACTIVE",
            "/workspace/llm4binary/github/license_c_cmakelists/pietern[P]goestools/vendor/nanomsg/src/transports/ipc/sipc.c"
            ,0xa4);
    fflush(_stderr);
    nn_err_abort();
  }
  if (*(int *)((long)&dst[7].body.u + 8) != 3) {
    nn_backtrace_print();
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","sipc->instate == NN_SIPC_INSTATE_HASMSG",
            "/workspace/llm4binary/github/license_c_cmakelists/pietern[P]goestools/vendor/nanomsg/src/transports/ipc/sipc.c"
            ,0xa5);
    fflush(_stderr);
    nn_err_abort();
  }
  fd = dst;
  nn_msg_mv(dst,in_stack_ffffffffffffffd8);
  nn_msg_init(dst,(size_t)in_stack_ffffffffffffffd8);
  *(undefined4 *)((long)&fd[7].body.u + 8) = 1;
  nn_usock_recv(unaff_retaddr,in_RDI,in_RSI,(int *)fd);
  return 0;
}

Assistant:

static int nn_sipc_recv (struct nn_pipebase *self, struct nn_msg *msg)
{
    struct nn_sipc *sipc;

    sipc = nn_cont (self, struct nn_sipc, pipebase);

    nn_assert_state (sipc, NN_SIPC_STATE_ACTIVE);
    nn_assert (sipc->instate == NN_SIPC_INSTATE_HASMSG);

    /*  Move received message to the user. */
    nn_msg_mv (msg, &sipc->inmsg);
    nn_msg_init (&sipc->inmsg, 0);

    /*  Start receiving new message. */
    sipc->instate = NN_SIPC_INSTATE_HDR;
    nn_usock_recv (sipc->usock, sipc->inhdr, sizeof (sipc->inhdr), NULL);

    return 0;
}